

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

missing_events * __thiscall
clipp::parser::missed(missing_events *__return_storage_ptr__,parser *this)

{
  pointer pmVar1;
  child_t<clipp::parameter,_clipp::group> *local_28;
  
  (__return_storage_ptr__->
  super__Vector_base<clipp::parser::missing_event,_std::allocator<clipp::parser::missing_event>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<clipp::parser::missing_event,_std::allocator<clipp::parser::missing_event>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<clipp::parser::missing_event,_std::allocator<clipp::parser::missing_event>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<clipp::parser::missing_event,_std::allocator<clipp::parser::missing_event>_>::reserve
            (__return_storage_ptr__,
             (long)(this->missCand_).
                   super__Vector_base<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->missCand_).
                   super__Vector_base<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
  for (pmVar1 = (this->missCand_).
                super__Vector_base<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pmVar1 != (this->missCand_).
                super__Vector_base<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>
                ._M_impl.super__Vector_impl_data._M_finish; pmVar1 = pmVar1 + 1) {
    local_28 = (pmVar1->pos).stack_.
               super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].cur._M_current;
    std::vector<clipp::parser::missing_event,std::allocator<clipp::parser::missing_event>>::
    emplace_back<clipp::parameter_const*,int_const&>
              ((vector<clipp::parser::missing_event,std::allocator<clipp::parser::missing_event>> *)
               __return_storage_ptr__,(parameter **)&local_28,&pmVar1->index);
  }
  return __return_storage_ptr__;
}

Assistant:

missing_events missed() const {
        missing_events misses;
        misses.reserve(missCand_.size());
        for(auto i = missCand_.begin(); i != missCand_.end(); ++i) {
            misses.emplace_back(&(i->pos->as_param()), i->index);
        }
        return misses;
    }